

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool LOADVerifyLibraryPath<char16_t>(char16_t *libraryPath)

{
  DWORD dwErrCode;
  
  if (libraryPath == (char16_t *)0x0) {
    dwErrCode = 0x7e;
  }
  else {
    if (*libraryPath != L'\0') {
      return true;
    }
    dwErrCode = 0x57;
  }
  if (PAL_InitializeChakraCoreCalled) {
    SetLastError(dwErrCode);
    return false;
  }
  abort();
}

Assistant:

static bool LOADVerifyLibraryPath(const TChar *libraryPath)
{
    if (libraryPath == nullptr)
    {
        ERROR("libraryPath is null\n");
        SetLastError(ERROR_MOD_NOT_FOUND);
        return false;
    }
    if (libraryPath[0] == '\0')
    {
        ERROR("libraryPath is empty\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }
    return true;
}